

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O1

void ASN1_template_free(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  size_t sVar2;
  ASN1_VALUE *vtmp;
  ASN1_VALUE *local_30;
  
  if ((tt->flags & 6) != 0) {
    sk = (OPENSSL_STACK *)*pval;
    sVar1 = OPENSSL_sk_num(sk);
    if (sVar1 != 0) {
      sVar1 = 0;
      do {
        local_30 = (ASN1_VALUE *)OPENSSL_sk_value(sk,sVar1);
        ASN1_item_ex_free(&local_30,(ASN1_ITEM *)tt->field_name);
        sVar1 = sVar1 + 1;
        sVar2 = OPENSSL_sk_num(sk);
      } while (sVar1 < sVar2);
    }
    OPENSSL_sk_free(sk);
    *pval = (ASN1_VALUE *)0x0;
    return;
  }
  ASN1_item_ex_free(pval,(ASN1_ITEM *)tt->field_name);
  return;
}

Assistant:

void ASN1_template_free(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    for (size_t i = 0; i < sk_ASN1_VALUE_num(sk); i++) {
      ASN1_VALUE *vtmp = sk_ASN1_VALUE_value(sk, i);
      ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
    }
    sk_ASN1_VALUE_free(sk);
    *pval = NULL;
  } else {
    ASN1_item_ex_free(pval, ASN1_ITEM_ptr(tt->item));
  }
}